

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O2

knote * knote_index_RB_MINMAX(knote_index *head,int val)

{
  knote *pkVar1;
  knote *pkVar2;
  
  pkVar2 = (knote *)0x0;
  while (pkVar1 = head->rbh_root, pkVar1 != (knote *)0x0) {
    pkVar2 = pkVar1;
    head = (knote_index *)(&(pkVar1->kn_index).rbe_left + ((uint)~val >> 0x1f));
  }
  return pkVar2;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}